

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::CompositorTimingHistory>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::CompositorTimingHistory> *this,
          CopyablePtr<perfetto::protos::gen::CompositorTimingHistory> *other)

{
  CompositorTimingHistory *this_00;
  CopyablePtr<perfetto::protos::gen::CompositorTimingHistory> *other_local;
  CopyablePtr<perfetto::protos::gen::CompositorTimingHistory> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::CompositorTimingHistory,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (CompositorTimingHistory *)operator_new(0x68);
  perfetto::protos::gen::CompositorTimingHistory::CompositorTimingHistory(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::CompositorTimingHistory,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }